

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.h
# Opt level: O0

void __thiscall gutil::Parameter::nextValue<double>(Parameter *this,double *v)

{
  byte bVar1;
  undefined8 uVar2;
  double *in_RSI;
  istringstream in;
  string s;
  string *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  char *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  Parameter *in_stack_ffffffffffffff90;
  string local_30 [32];
  double *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30);
  nextString(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)&stack0xfffffffffffffe40,local_30,_S_in);
  std::istream::operator>>(&stack0xfffffffffffffe40,local_10);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::istringstream::~istringstream((istringstream *)&stack0xfffffffffffffe40);
    std::__cxx11::string::~string(local_30);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  IOException::IOException((IOException *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  __cxa_throw(uVar2,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

void nextValue(T &v)
    {
      std::string s;

      nextString(s);

      std::istringstream in(s);
      in >> v;

      if (in.fail())
      {
        throw IOException("Format error of argument: "+s);
      }
    }